

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O1

double __thiscall Symbol_table::get_value(Symbol_table *this,string *s)

{
  pointer pVVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  undefined8 uVar4;
  Variable *var;
  pointer pVVar5;
  bool bVar6;
  bool bVar7;
  double local_58;
  string local_50;
  
  pVVar5 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  bVar6 = pVVar5 == pVVar1;
  if (!bVar6) {
    __s2 = (s->_M_dataplus)._M_p;
    sVar2 = s->_M_string_length;
    do {
      __n = (pVVar5->name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp((pVVar5->name)._M_dataplus._M_p,__s2,__n);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        local_58 = pVVar5->value;
        break;
      }
      pVVar5 = pVVar5 + 1;
      bVar6 = pVVar5 == pVVar1;
    } while (!bVar6);
  }
  if (!bVar6) {
    return local_58;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"get: undefined name ","");
  error(&local_50,s);
  uVar4 = std::__cxx11::string::~string((string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

double Symbol_table::get_value(const string& s)
{
	for (auto&& var : var_table)
		if (var.name == s)
			return var.value;
	error("get: undefined name ", s);
}